

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

uint hash(char *p)

{
  char *pcVar1;
  uint local_18;
  uint h;
  uint g;
  char *p_local;
  
  local_18 = 0;
  _h = p;
  while (*_h != '\0') {
    pcVar1 = _h + 1;
    local_18 = local_18 * 0x10 + (int)*_h;
    _h = pcVar1;
    if ((local_18 & 0xf0000000) != 0) {
      local_18 = ((local_18 & 0xf0000000) >> 0x18 ^ local_18) & 0xfffffff;
    }
  }
  return local_18;
}

Assistant:

static unsigned long FASTCALL
hash(XML_Parser parser, KEY s)
{
  struct siphash state;
  struct sipkey key;
  (void)sip_tobin;
  (void)sip24_valid;
  copy_salt_to_sipkey(parser, &key);
  sip24_init(&state, &key);
  sip24_update(&state, s, keylen(s) * sizeof(XML_Char));
  return (unsigned long)sip24_final(&state);
}